

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O3

uint __thiscall
glcts::TessellationShaderInvarianceRule7Test::getTestIterationIndex
          (TessellationShaderInvarianceRule7Test *this,bool is_triangles_iteration,
          float *inner_tess_levels,float *outer_tess_levels,
          _tessellation_shader_vertex_ordering vertex_ordering,uint n_modified_outer_tess_level)

{
  undefined7 in_register_00000031;
  pointer p_Var1;
  _test_iterations *p_Var2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  
  p_Var2 = &this->m_test_triangles_iterations;
  if ((int)CONCAT71(in_register_00000031,is_triangles_iteration) == 0) {
    p_Var2 = &this->m_test_quads_iterations;
  }
  p_Var1 = (p_Var2->
           super__Vector_base<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(p_Var2->
                 super__Vector_base<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)p_Var1 >> 2) *
          0x2e8ba2e8ba2e8ba3;
  if ((int)uVar3 != 0) {
    uVar4 = 0;
    do {
      fVar5 = p_Var1->inner_tess_levels[0] - *inner_tess_levels;
      fVar6 = -fVar5;
      if (-fVar5 <= fVar5) {
        fVar6 = fVar5;
      }
      if (fVar6 < 1e-05) {
        fVar5 = p_Var1->inner_tess_levels[1] - inner_tess_levels[1];
        fVar6 = -fVar5;
        if (-fVar5 <= fVar5) {
          fVar6 = fVar5;
        }
        if (((fVar6 < 1e-05) && (p_Var1->vertex_ordering == vertex_ordering)) &&
           (p_Var1->n_modified_outer_tess_level == n_modified_outer_tess_level)) {
          if (n_modified_outer_tess_level == 0) {
LAB_00d24ab3:
            fVar5 = p_Var1->outer_tess_levels[1] - outer_tess_levels[1];
            fVar6 = -fVar5;
            if (-fVar5 <= fVar5) {
              fVar6 = fVar5;
            }
            if (fVar6 < 1e-05) {
              if (n_modified_outer_tess_level != 2) goto LAB_00d24acd;
LAB_00d24ae7:
              fVar5 = p_Var1->outer_tess_levels[3] - outer_tess_levels[3];
              fVar6 = -fVar5;
              if (-fVar5 <= fVar5) {
                fVar6 = fVar5;
              }
              if (fVar6 < 1e-05) {
LAB_00d24b0c:
                return (uint)uVar4;
              }
            }
          }
          else {
            fVar5 = p_Var1->outer_tess_levels[0] - *outer_tess_levels;
            fVar6 = -fVar5;
            if (-fVar5 <= fVar5) {
              fVar6 = fVar5;
            }
            if (fVar6 < 1e-05) {
              if (n_modified_outer_tess_level != 1) goto LAB_00d24ab3;
LAB_00d24acd:
              fVar5 = p_Var1->outer_tess_levels[2] - outer_tess_levels[2];
              fVar6 = -fVar5;
              if (-fVar5 <= fVar5) {
                fVar6 = fVar5;
              }
              if (fVar6 < 1e-05) {
                if (n_modified_outer_tess_level == 3) goto LAB_00d24b0c;
                goto LAB_00d24ae7;
              }
            }
          }
        }
      }
      uVar4 = uVar4 + 1;
      p_Var1 = p_Var1 + 1;
    } while ((uVar3 & 0xffffffff) != uVar4);
  }
  return 0xffffffff;
}

Assistant:

unsigned int TessellationShaderInvarianceRule7Test::getTestIterationIndex(
	bool is_triangles_iteration, const float* inner_tess_levels, const float* outer_tess_levels,
	_tessellation_shader_vertex_ordering vertex_ordering, unsigned int n_modified_outer_tess_level)
{
	const float				epsilon = 1e-5f;
	unsigned int			result  = 0xFFFFFFFF;
	const _test_iterations& test_iterations =
		(is_triangles_iteration) ? m_test_triangles_iterations : m_test_quads_iterations;
	const unsigned int n_test_iterations = (const unsigned int)test_iterations.size();

	for (unsigned int n_test_iteration = 0; n_test_iteration < n_test_iterations; ++n_test_iteration)
	{
		_test_iteration test_iteration = test_iterations[n_test_iteration];

		if (de::abs(test_iteration.inner_tess_levels[0] - inner_tess_levels[0]) < epsilon &&
			de::abs(test_iteration.inner_tess_levels[1] - inner_tess_levels[1]) < epsilon &&
			test_iteration.vertex_ordering == vertex_ordering &&
			test_iteration.n_modified_outer_tess_level == n_modified_outer_tess_level)
		{
			/* Only compare outer tessellation levels that have not been modified */
			if (((n_modified_outer_tess_level == 0) ||
				 (n_modified_outer_tess_level != 0 &&
				  de::abs(test_iteration.outer_tess_levels[0] - outer_tess_levels[0]) < epsilon)) &&
				((n_modified_outer_tess_level == 1) ||
				 (n_modified_outer_tess_level != 1 &&
				  de::abs(test_iteration.outer_tess_levels[1] - outer_tess_levels[1]) < epsilon)) &&
				((n_modified_outer_tess_level == 2) ||
				 (n_modified_outer_tess_level != 2 &&
				  de::abs(test_iteration.outer_tess_levels[2] - outer_tess_levels[2]) < epsilon)) &&
				((n_modified_outer_tess_level == 3) ||
				 (n_modified_outer_tess_level != 3 &&
				  de::abs(test_iteration.outer_tess_levels[3] - outer_tess_levels[3]) < epsilon)))
			{
				result = n_test_iteration;

				break;
			}
		}
	} /* for (all test iterations) */

	return result;
}